

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_10b69d9::CloseButton::paintEvent(CloseButton *this,QPaintEvent *param_1)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  QStyle *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_70,
                     &(this->super_QAbstractButton).super_QWidget.super_QPaintDevice);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_68,1,0);
  QStyleOption::initFrom((QStyleOption *)&local_68,(QWidget *)this);
  puStack_60 = (undefined1 *)((ulong)puStack_60 | 0x1000);
  if ((((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 3) == 2) &&
      (bVar1 = QAbstractButton::isChecked(&this->super_QAbstractButton), !bVar1)) &&
     (bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton), !bVar1)) {
    puStack_60 = (undefined1 *)((ulong)puStack_60 | 2);
  }
  bVar1 = QAbstractButton::isChecked(&this->super_QAbstractButton);
  if (bVar1) {
    puStack_60 = (undefined1 *)((ulong)puStack_60 | 0x20);
  }
  bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton);
  if (bVar1) {
    puStack_60 = (undefined1 *)((ulong)puStack_60 | 4);
  }
  lVar3 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
  if (lVar3 != 0) {
    uVar4 = (ulong)*(int *)(*(long *)(lVar3 + 8) + 700);
    if ((long)uVar4 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    else {
      uVar6 = 0xffffffffffffffff;
      if (uVar4 < *(ulong *)(*(long *)(lVar3 + 8) + 0x2e8)) {
        uVar6 = uVar4;
      }
    }
    pQVar5 = QWidget::style((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x5c,0,lVar3,0);
    if (((uVar6 < *(ulong *)(*(long *)(lVar3 + 8) + 0x2e8)) &&
        (lVar3 = *(long *)(*(long *)(*(long *)(lVar3 + 8) + 0x2e0) + uVar6 * 8), lVar3 != 0)) &&
       (*(CloseButton **)(lVar3 + 200 + (ulong)(iVar2 != 0) * 8) == this)) {
      puStack_60 = (undefined1 *)((ulong)puStack_60 | 0x8000);
    }
  }
  pQVar5 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar5 + 0xb0))
            (pQVar5,0x2f,(QStyleOption *)&local_68,(QPainter *)&local_70,this);
  QStyleOption::~QStyleOption((QStyleOption *)&local_68);
  QPainter::~QPainter((QPainter *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CloseButton::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;
    if (isEnabled() && underMouse() && !isChecked() && !isDown())
        opt.state |= QStyle::State_Raised;
    if (isChecked())
        opt.state |= QStyle::State_On;
    if (isDown())
        opt.state |= QStyle::State_Sunken;

    if (const QTabBar *tb = qobject_cast<const QTabBar *>(parent())) {
        int index = tb->currentIndex();
        QTabBar::ButtonPosition position = (QTabBar::ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, tb);
        if (tb->tabButton(index, position) == this)
            opt.state |= QStyle::State_Selected;
    }

    style()->drawPrimitive(QStyle::PE_IndicatorTabClose, &opt, &p, this);
}